

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppp.cpp
# Opt level: O1

void __thiscall pg::PPPSolver::run(PPPSolver *this)

{
  Game *pGVar1;
  uint64_t *puVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  int *__s;
  int *piVar12;
  ostream *poVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint i;
  ulong uVar18;
  pointer *ppiVar19;
  uint p;
  
  pGVar1 = (this->super_PPSolver).super_Solver.game;
  iVar14 = *(int *)((long)pGVar1->_priority + ((pGVar1->n_vertices << 0x20) + -0x100000000 >> 0x1e))
  ;
  uVar18 = (ulong)(iVar14 + 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar18;
  uVar8 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar9 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar9 = 0xffffffffffffffff;
  }
  (this->super_PPSolver).max_prio = iVar14;
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar9);
  *puVar10 = uVar18;
  if (iVar14 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar10 + 1),0,
           ((uVar18 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  (this->super_PPSolver).regions = (vector<int,_std::allocator<int>_> *)(puVar10 + 1);
  piVar11 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                  pGVar1->n_vertices << 2);
  (this->super_PPSolver).region = piVar11;
  __s = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                              pGVar1->n_vertices << 2);
  (this->super_PPSolver).strategy = __s;
  uVar18 = uVar18 << 2;
  if (iVar14 < -1) {
    uVar18 = 0xffffffffffffffff;
  }
  piVar12 = (int *)operator_new__(uVar18);
  (this->super_PPSolver).inverse = piVar12;
  uVar8 = pGVar1->n_vertices;
  if (0 < (long)uVar8) {
    puVar2 = ((this->super_PPSolver).super_Solver.disabled)->_bits;
    uVar9 = 0;
    do {
      iVar14 = -2;
      if ((puVar2[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
        iVar14 = pGVar1->_priority[uVar9];
      }
      piVar11[uVar9] = iVar14;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (0 < (long)uVar8) {
    memset(__s,0xff,uVar8 * 4);
  }
  this->reset0 = -1;
  this->reset1 = -1;
  uVar17 = (int)uVar8 - 1;
  (this->super_PPSolver).promotions = 0;
  do {
    uVar8 = (ulong)uVar17;
    if ((int)uVar17 < 0) break;
    piVar11 = ((this->super_PPSolver).super_Solver.game)->_priority;
    p = piVar11[uVar8];
    do {
      i = (uint)uVar8;
      if ((piVar11[uVar8] != p) ||
         (((((this->super_PPSolver).super_Solver.disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1)
           == 0 && ((this->super_PPSolver).region[uVar8] <= (int)p)))) goto LAB_0015d6f6;
      uVar8 = (ulong)(i - 1);
    } while (0 < (int)i);
    i = 0xffffffff;
LAB_0015d6f6:
    uVar17 = 0xffffffff;
    if (-1 < (int)i) {
      if (piVar11[i] == p) {
        (this->super_PPSolver).inverse[(int)p] = i;
        if ((p & 1) == 0) {
          if (this->reset0 < (int)p) goto LAB_0015d773;
          this->reset0 = p - 2;
LAB_0015d790:
          bVar7 = true;
        }
        else {
          if ((int)p <= this->reset1) {
            this->reset1 = p - 2;
            goto LAB_0015d790;
          }
LAB_0015d773:
          bVar7 = false;
        }
        bVar7 = PPSolver::setupRegion(&this->super_PPSolver,i,p,bVar7);
        if (bVar7) {
          uVar8 = (ulong)i;
          do {
            if (1 < (this->super_PPSolver).super_Solver.trace) {
              PPSolver::reportRegion(&this->super_PPSolver,p);
            }
            uVar17 = (*(this->super_PPSolver).super_Solver._vptr_Solver[4])(this,uVar8,(ulong)p);
            if (uVar17 == 0xffffffff) {
              PPSolver::setDominion(&this->super_PPSolver,p);
              pGVar1 = (this->super_PPSolver).super_Solver.game;
              uVar15 = (int)pGVar1->n_vertices - 1;
              uVar8 = (ulong)uVar15;
              piVar11 = pGVar1->_priority;
              uVar17 = piVar11[(int)uVar15];
              this->reset0 = uVar17;
              iVar14 = piVar11[(int)uVar15];
              this->reset1 = iVar14;
              if ((uVar17 & 1) == 0) {
                this->reset1 = iVar14 + -1;
              }
              else {
                this->reset0 = uVar17 - 1;
              }
LAB_0015d87b:
              bVar7 = false;
            }
            else {
              if (uVar17 == 0xfffffffe) {
                if (-1 < (int)uVar8) {
                  do {
                    iVar14 = (int)uVar8;
                    if (((this->super_PPSolver).super_Solver.game)->_priority[uVar8] < (int)p)
                    goto LAB_0015d87b;
                    uVar8 = (ulong)(iVar14 - 1);
                  } while (0 < iVar14);
                  uVar8 = 0xffffffff;
                }
                goto LAB_0015d87b;
              }
              PPSolver::promote(&this->super_PPSolver,p,uVar17);
              if ((uVar17 & 1) == 0) {
                if (this->reset1 < (int)uVar17) {
                  this->reset1 = uVar17 - 1;
                }
              }
              else if (this->reset0 < (int)uVar17) {
                this->reset0 = uVar17 - 1;
              }
              uVar8 = (ulong)(uint)(this->super_PPSolver).inverse[(int)uVar17];
              bVar7 = true;
              p = uVar17;
            }
            uVar17 = (uint)uVar8;
          } while (bVar7);
        }
        else {
          uVar15 = i;
          do {
            uVar17 = uVar15;
            if (((this->super_PPSolver).super_Solver.game)->_priority[uVar15] != p) break;
            bVar7 = 0 < (int)uVar15;
            uVar17 = 0xffffffff;
            uVar15 = uVar15 - 1;
          } while (bVar7);
        }
      }
      else {
        pvVar3 = (this->super_PPSolver).regions;
        uVar17 = i;
        if (pvVar3[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            pvVar3[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          PPSolver::resetRegion(&this->super_PPSolver,p);
          if ((p & 1) == 0) {
            this->reset0 = p - 2;
          }
          else {
            this->reset1 = p - 2;
          }
        }
      }
    }
  } while (-1 < (int)i);
  pvVar3 = (this->super_PPSolver).regions;
  if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar4 = pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar19 = &pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar4 != (pointer)0x0) {
      lVar16 = (long)piVar4 * 0x18;
      do {
        pvVar5 = *(void **)((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar16);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)ppiVar19 + lVar16) - (long)pvVar5);
        }
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != 0);
    }
    operator_delete__(ppiVar19,(long)piVar4 * 0x18 + 8);
  }
  piVar11 = (this->super_PPSolver).region;
  if (piVar11 != (int *)0x0) {
    operator_delete__(piVar11);
  }
  piVar11 = (this->super_PPSolver).strategy;
  if (piVar11 != (int *)0x0) {
    operator_delete__(piVar11);
  }
  piVar11 = (this->super_PPSolver).inverse;
  if (piVar11 != (int *)0x0) {
    operator_delete__(piVar11);
  }
  poVar13 = (this->super_PPSolver).super_Solver.logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"solved with ",0xc);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,(this->super_PPSolver).promotions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," promotions.",0xc);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  return;
}

Assistant:

void
PPPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize reset values
    reset0 = -1;
    reset1 = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) {
                resetRegion(p);
                // but then we must also reset everything lower...
                if (p&1) reset1 = p-2;
                else reset0 = p-2;
            }
            continue;
        }

        inverse[p] = i;

        // PPP: reset if lower than value
        bool reset = false;
        if (p&1) {
            if (p <= reset1) {
                reset = true;
                reset1 = p-2;
            }
        } else {
            if (p <= reset0) {
                reset = true;
                reset0 = p-2;
            }
        }
        if (setupRegion(i, p, reset)) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) >= p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion, return
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    reset0 = priority(nodecount()-1);
                    reset1 = priority(nodecount()-1);
                    if (reset0&1) reset0--;
                    else reset1--;
                    break;
                } else {
                    // found promotion, promote
                    promote(p, res);
                    // increase reset value if needed
                    if (res&1) {
                        if (res > reset0) reset0 = res-1;
                    } else {
                        if (res > reset1) reset1 = res-1;
                    }
                    // continue inner loop with higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}